

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_helpers.cc
# Opt level: O0

string * __thiscall
google::protobuf::compiler::java::(anonymous_namespace)::FieldName_abi_cxx11_
          (string *__return_storage_ptr__,_anonymous_namespace_ *this,FieldDescriptor *field)

{
  bool bVar1;
  Type TVar2;
  Descriptor *this_00;
  string *psVar3;
  FieldDescriptor *field_local;
  string *field_name;
  
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  TVar2 = GetType((FieldDescriptor *)this);
  if (TVar2 == TYPE_GROUP) {
    this_00 = FieldDescriptor::message_type((FieldDescriptor *)this);
    psVar3 = Descriptor::name_abi_cxx11_(this_00);
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)psVar3);
  }
  else {
    psVar3 = FieldDescriptor::name_abi_cxx11_((FieldDescriptor *)this);
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)psVar3);
  }
  bVar1 = anon_unknown_0::IsForbidden(__return_storage_ptr__);
  if (bVar1) {
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"#");
  }
  return __return_storage_ptr__;
}

Assistant:

string FieldName(const FieldDescriptor* field) {
  string field_name;
  // Groups are hacky:  The name of the field is just the lower-cased name
  // of the group type.  In Java, though, we would like to retain the original
  // capitalization of the type name.
  if (GetType(field) == FieldDescriptor::TYPE_GROUP) {
    field_name = field->message_type()->name();
  } else {
    field_name = field->name();
  }
  if (IsForbidden(field_name)) {
    // Append a trailing "#" to indicate that the name should be decorated to
    // avoid collision with other names.
    field_name += "#";
  }
  return field_name;
}